

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O2

bool __thiscall ConfigReader::parseDesignName(ConfigReader *this)

{
  token_t tVar1;
  bool bVar2;
  string designName;
  string tokstr;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  tVar1 = tokenize(this,&local_50);
  if (tVar1 == TOK_IDENT) {
    tVar1 = tokenize(this,&local_30);
    if (tVar1 == TOK_SEMICOL) {
      bVar2 = true;
      (*this->_vptr_ConfigReader[9])(this,&local_50);
      goto LAB_00124c47;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Expected ;\n",&local_71)
    ;
    error(this,&local_70);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Expected a design name\n",&local_71);
    error(this,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  bVar2 = false;
LAB_00124c47:
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

bool ConfigReader::parseDesignName()
{
    // DESIGN: designname
    std::string tokstr;
    std::string designName;

    // designname
    ConfigReader::token_t tok = tokenize(designName);
    if (tok != TOK_IDENT)
    {
        error("Expected a design name\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    onDesignName(designName);
    return true;
}